

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_ping.cpp
# Opt level: O0

bool __thiscall dev_ping::Impl::host_resolve(Impl *this,string *hostname)

{
  bool bVar1;
  char *host;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [48];
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *hostname_local;
  Impl *this_local;
  
  local_20 = hostname;
  hostname_local = (string *)this;
  host = (char *)std::__cxx11::string::c_str();
  bVar1 = getsockaddr(this,host,&this->m_dest_addr);
  if (bVar1) {
    std::operator+((char *)local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Ping: hostname \'");
    std::operator+(local_d0,(char *)local_f0);
    inet_ntoa((in_addr)(this->m_dest_addr).sin_addr.s_addr);
    std::operator+(local_b0,(char *)local_d0);
    std::operator+(local_90,(char *)local_b0);
    std::__cxx11::string::append((string *)&this->status);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string(local_f0);
    this->host_is_resolve = true;
  }
  else {
    std::operator+((char *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Ping:        Unknow host \'");
    std::operator+(local_40,(char *)local_60);
    std::__cxx11::string::append((string *)&this->status);
    std::__cxx11::string::~string((string *)local_40);
    std::__cxx11::string::~string(local_60);
    deinit(this);
  }
  return bVar1;
}

Assistant:

bool dev_ping::Impl::host_resolve(const std::string &hostname)
{
    // host resolve
    if (!getsockaddr(hostname.c_str(), &m_dest_addr)) {
        status.append("Ping:        Unknow host '" + hostname + "' !\n");
        deinit();
        return false;
    }

    status.append("Ping: hostname '" + hostname + "' (to ip: " + inet_ntoa(m_dest_addr.sin_addr) + /*", from self iface ip " + inet_ntoa(m_from_addr.sin_addr) +*/ ")\n");

    host_is_resolve = true;
    return true;
}